

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

int LoadMultiChannelEXRFromFile(EXRImage *exrImage,char *filename,char **err)

{
  int iVar1;
  FILE *__stream;
  size_type __n;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator_type local_49;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  if (exrImage == (EXRImage *)0x0) {
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar3 = "Invalid argument.";
  }
  else {
    __stream = fopen(filename,"rb");
    if (__stream != (FILE *)0x0) {
      fseek(__stream,0,2);
      __n = ftell(__stream);
      fseek(__stream,0,0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_48,__n,&local_49);
      sVar2 = fread(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,1,__n,__stream);
      if (sVar2 != __n) {
        __assert_fail("ret == filesize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/15462-f16[P]Scotty3D/CMU462/include/CMU462/tinyexr.h"
                      ,0x234f,
                      "int LoadMultiChannelEXRFromFile(EXRImage *, const char *, const char **)");
      }
      fclose(__stream);
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        iVar1 = LoadMultiChannelEXRFromMemory
                          (exrImage,local_48.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start,err);
        if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == (uchar *)0x0) {
          return iVar1;
        }
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
        return iVar1;
      }
      uVar4 = std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,0,0);
      if (local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uchar *)0x0) {
        operator_delete(local_48.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_48.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      _Unwind_Resume(uVar4);
    }
    if (err == (char **)0x0) {
      return -1;
    }
    pcVar3 = "Cannot read file.";
  }
  *err = pcVar3;
  return -1;
}

Assistant:

int LoadMultiChannelEXRFromFile(EXRImage *exrImage, const char *filename,
                                const char **err) {
  if (exrImage == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return -1;
  }

  FILE *fp = fopen(filename, "rb");
  if (!fp) {
    if (err) {
      (*err) = "Cannot read file.";
    }
    return -1;
  }

  size_t filesize;
  // Compute size
  fseek(fp, 0, SEEK_END);
  filesize = ftell(fp);
  fseek(fp, 0, SEEK_SET);

  std::vector<unsigned char> buf(filesize); // @todo { use mmap }
  {
    size_t ret;
    ret = fread(&buf[0], 1, filesize, fp);
    assert(ret == filesize);
    fclose(fp);
    (void)ret;
  }

  return LoadMultiChannelEXRFromMemory(exrImage, &buf.at(0), err);
}